

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::Parse
          (Status *__return_storage_ptr__,JsonStreamParser *this,StringPiece json)

{
  string *result;
  uint uVar1;
  Status *pSVar2;
  StringPiece chunk;
  StringPiece local_78;
  Status *local_48;
  StringPiece local_40;
  
  local_40.length_ = json.length_;
  local_40.ptr_ = json.ptr_;
  local_48 = __return_storage_ptr__;
  if ((this->leftover_)._M_string_length != 0) {
    result = &this->chunk_storage_;
    std::__cxx11::string::swap((string *)result);
    local_78 = json;
    StrAppend(result,(AlphaNum *)&local_78);
    StringPiece::StringPiece<std::allocator<char>>(&local_40,result);
  }
  uVar1 = protobuf::internal::UTF8SpnStructurallyValid(&local_40);
  if ((int)uVar1 < 1) {
    std::__cxx11::string::assign((char *)&this->leftover_,(ulong)local_40.ptr_);
    pSVar2 = local_48;
    Status::Status(local_48);
  }
  else {
    chunk = StringPiece::substr(&local_40,0,(ulong)uVar1);
    pSVar2 = local_48;
    ParseChunk(local_48,this,chunk);
    local_78 = StringPiece::substr(&local_40,(ulong)uVar1,0xffffffffffffffff);
    StrAppend(&this->leftover_,(AlphaNum *)&local_78);
  }
  return pSVar2;
}

Assistant:

util::Status JsonStreamParser::Parse(StringPiece json) {
  StringPiece chunk = json;
  // If we have leftovers from a previous chunk, append the new chunk to it
  // and create a new StringPiece pointing at the string's data. This could
  // be large but we rely on the chunks to be small, assuming they are
  // fragments of a Cord.
  if (!leftover_.empty()) {
    // Don't point chunk to leftover_ because leftover_ will be updated in
    // ParseChunk(chunk).
    chunk_storage_.swap(leftover_);
    StrAppend(&chunk_storage_, json);
    chunk = StringPiece(chunk_storage_);
  }

  // Find the structurally valid UTF8 prefix and parse only that.
  int n = internal::UTF8SpnStructurallyValid(chunk);
  if (n > 0) {
    util::Status status = ParseChunk(chunk.substr(0, n));

    // Any leftover characters are stashed in leftover_ for later parsing when
    // there is more data available.
    StrAppend(&leftover_, chunk.substr(n));
    return status;
  } else {
    leftover_.assign(chunk.data(), chunk.size());
    return util::Status();
  }
}